

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O3

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_sub
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  ulong *puVar1;
  pointer p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  vector<__int128,_std::allocator<__int128>_> *pvVar6;
  pointer p_Var7;
  pointer p_Var8;
  reed_solomn *prVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  vector<__int128,_std::allocator<__int128>_> res;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  tmp;
  undefined1 local_d8 [8];
  __int128 *p_Stack_d0;
  __int128 *local_c8;
  vector<__int128,_std::allocator<__int128>_> *local_c0;
  reed_solomn *local_b8;
  pointer local_b0;
  vector<__int128,_std::allocator<__int128>_> local_a8;
  vector<__int128,_std::allocator<__int128>_> local_90;
  vector<__int128,_std::allocator<__int128>_> local_78;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  local_60;
  undefined1 local_48 [16];
  
  local_d8 = (undefined1  [8])0x0;
  p_Stack_d0 = (__int128 *)0x0;
  local_c8 = (__int128 *)0x0;
  local_b8 = this;
  std::vector<__int128,_std::allocator<__int128>_>::vector(&local_78,A);
  prVar9 = (reed_solomn *)b;
  std::vector<__int128,_std::allocator<__int128>_>::vector(&local_90,b);
  poly_align(&local_60,prVar9,&local_78,&local_90);
  if (local_90.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (A,local_60.
               super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (b,local_60.
               super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
  p_Var8 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_start;
  p_Var7 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c0 = __return_storage_ptr__;
  if ((long)p_Var7 - (long)p_Var8 ==
      (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    if (p_Var7 != p_Var8) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        p_Var2 = (b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (ulong *)((long)p_Var2 + lVar11);
        uVar3 = (undefined8)local_b8->PRIME;
        uVar4 = *(undefined8 *)((long)&local_b8->PRIME + 8);
        auVar5 = (undefined1  [16])local_b8->PRIME;
        local_b0 = p_Var7;
        auVar12 = __modti3(*(ulong *)((long)p_Var8 + lVar11) - *puVar1,
                           (*(long *)((long)p_Var8 + lVar11 + 8) -
                           *(long *)((long)p_Var2 + lVar11 + 8)) -
                           (ulong)(*(ulong *)((long)p_Var8 + lVar11) < *puVar1),uVar3,uVar4);
        auVar12 = auVar12 + auVar5;
        auVar12 = __modti3(auVar12._0_8_,auVar12._8_8_,uVar3,uVar4);
        local_48 = auVar12;
        if (p_Stack_d0 == local_c8) {
          std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                    ((vector<__int128,_std::allocator<__int128>_> *)local_d8,(iterator)p_Stack_d0,
                     (__int128 *)local_48);
          p_Var8 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          p_Var7 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        else {
          *p_Stack_d0 = (__int128)auVar12;
          p_Stack_d0 = p_Stack_d0 + 1;
          p_Var7 = local_b0;
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar10 < (ulong)((long)p_Var7 - (long)p_Var8 >> 4));
    }
    prVar9 = (reed_solomn *)local_d8;
    std::vector<__int128,_std::allocator<__int128>_>::vector
              (&local_a8,(vector<__int128,_std::allocator<__int128>_> *)prVar9);
    pvVar6 = local_c0;
    poly_strip(local_c0,prVar9,&local_a8);
    if (local_a8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
    ::~vector(&local_60);
    if (local_d8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
    }
    return pvVar6;
  }
  __assert_fail("A.size() == b.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SMMLF[P]MPL-Public/malicious_lib/reed_solomn_reconstruct.cpp"
                ,0x96,"vector<ll128> reed_solomn::poly_sub(vector<ll128>, vector<ll128>)");
}

Assistant:

vector<ll128> reed_solomn::poly_sub(vector<ll128> A, vector<ll128> b) {
    vector<ll128> res;
    vector<vector<ll128>> tmp = poly_align(A, b);
    A = tmp[0];
    b = tmp[1];
    assert(A.size() == b.size());
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_sub(A[i], b[i]));
    }
    return poly_strip(res);
}